

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::anon_unknown_0::ReconstructMaterialBindingProperties
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *properties,MaterialBinding *mb,string *err)

{
  _Base_ptr __lhs;
  bool bVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  uint *rel;
  undefined **in;
  char *pcVar5;
  MaterialBinding *this;
  int iVar6;
  bool bVar7;
  string collection_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  allocator local_201;
  MaterialBinding *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  MaterialBinding *local_1d8;
  MaterialBinding *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  if (mb == (MaterialBinding *)0x0) {
LAB_001cf5a3:
    bVar7 = false;
  }
  else {
    p_Var3 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1d0 = (MaterialBinding *)&mb->materialBindingPreview;
    local_1d8 = (MaterialBinding *)&mb->materialBindingFull;
    rel = (uint *)err;
    local_200 = mb;
    while( true ) {
      bVar7 = (_Rb_tree_header *)p_Var3 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      if (bVar7) break;
      __lhs = p_Var3 + 1;
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"material:binding");
      if (bVar1) {
        ::std::__cxx11::string::string
                  ((string *)&ss_e,"material:binding",(allocator *)&collection_name);
        sVar2 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(table,(key_type *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        if (sVar2 != 0) goto LAB_001cf09c;
        if (((ulong)p_Var3[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          if (*(uint *)&p_Var3[0x17]._M_left < 4) {
            rel = &switchD_001ce9a0::switchdataD_00331980;
            switch(*(uint *)&p_Var3[0x17]._M_left) {
            default:
              nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                        (&local_200->materialBinding,(Relationship *)&p_Var3[0x17]._M_left);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs);
              goto LAB_001ce9b9;
            case 1:
              goto switchD_001ce9a0_caseD_1;
            case 2:
              if ((long)p_Var3[0x1e]._M_left - (long)p_Var3[0x1e]._M_parent != 0xd0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x9f0);
                ::std::operator<<(poVar4," ");
                pcVar5 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
                goto LAB_001cf3f5;
              }
switchD_001ce9a0_caseD_1:
              this = local_200;
            }
            goto LAB_001cf08a;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x9f0);
          ::std::operator<<(poVar4," ");
          pcVar5 = "Internal error. Property `{}` is not a valid Relationship.";
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x9f0);
          ::std::operator<<(poVar4," ");
          pcVar5 = "Property `{}` must be a Relationship.";
        }
LAB_001cf3f5:
        ::std::__cxx11::string::string((string *)&local_228,pcVar5,(allocator *)&local_1f8);
        in = &kMaterialBinding;
LAB_001cf50f:
        fmt::format<char_const*>(&collection_name,(fmt *)&local_228,(string *)in,(char **)rel);
        poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&collection_name);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
LAB_001cf544:
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &collection_name,&local_228,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&collection_name);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        goto LAB_001cf5a3;
      }
LAB_001ce9b9:
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"material:binding:preview");
      if (bVar1) {
        ::std::__cxx11::string::string
                  ((string *)&ss_e,"material:binding:preview",(allocator *)&collection_name);
        sVar2 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(table,(key_type *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        if (sVar2 != 0) goto LAB_001cf09c;
        if (((ulong)p_Var3[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          if (*(uint *)&p_Var3[0x17]._M_left < 4) {
            rel = &switchD_001cea4a::switchdataD_00331990;
            switch(*(uint *)&p_Var3[0x17]._M_left) {
            default:
              nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                        (&local_1d0->materialBinding,(Relationship *)&p_Var3[0x17]._M_left);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs);
              goto LAB_001cea66;
            case 1:
              goto switchD_001cea4a_caseD_1;
            case 2:
              if ((long)p_Var3[0x1e]._M_left - (long)p_Var3[0x1e]._M_parent != 0xd0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
                poVar4 = ::std::operator<<(poVar4,"():");
                iVar6 = 0x9f1;
LAB_001cf94d:
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,iVar6);
                ::std::operator<<(poVar4," ");
                pcVar5 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
                goto LAB_001cf4f6;
              }
switchD_001cea4a_caseD_1:
              this = local_1d0;
            }
            goto LAB_001cf08a;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
          poVar4 = ::std::operator<<(poVar4,"():");
          iVar6 = 0x9f1;
LAB_001cf8ca:
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,iVar6);
          ::std::operator<<(poVar4," ");
          pcVar5 = "Internal error. Property `{}` is not a valid Relationship.";
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
          poVar4 = ::std::operator<<(poVar4,"():");
          iVar6 = 0x9f1;
LAB_001cf4db:
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,iVar6);
          ::std::operator<<(poVar4," ");
          pcVar5 = "Property `{}` must be a Relationship.";
        }
LAB_001cf4f6:
        ::std::__cxx11::string::string((string *)&local_228,pcVar5,(allocator *)&local_1f8);
        in = &kMaterialBindingPreview;
        goto LAB_001cf50f;
      }
LAB_001cea66:
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"material:binding:preview");
      if (!bVar1) {
LAB_001ceb13:
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"material:binding:collection");
        if (bVar1) {
          sVar2 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(table,(key_type *)__lhs);
          if (sVar2 == 0) {
            if (((ulong)p_Var3[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
              poVar4 = ::std::operator<<(poVar4,"():");
              iVar6 = 0x9fb;
              goto LAB_001cf9d0;
            }
            rel = (uint *)&p_Var3[0x17]._M_left;
            Token::Token((Token *)&ss_e,"");
            Token::Token((Token *)&collection_name,"");
            MaterialBinding::set_materialBindingCollection
                      (local_200,(token *)&ss_e,(token *)&collection_name,(Relationship *)rel);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            goto LAB_001cf08f;
          }
          goto LAB_001cf09c;
        }
        ::std::__cxx11::string::string((string *)&collection_name,":",(allocator *)&local_228);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e,
                         "material:binding:collection",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &collection_name);
        bVar1 = startsWith((string *)__lhs,(string *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (bVar1) {
          sVar2 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(table,(key_type *)__lhs);
          if (sVar2 == 0) {
            if (((ulong)p_Var3[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
              poVar4 = ::std::operator<<(poVar4,"():");
              iVar6 = 0xa0d;
              goto LAB_001cf9d0;
            }
            ::std::__cxx11::string::string((string *)&local_228,":",(allocator *)&local_1f8);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ss_e,"material:binding:collection",&local_228);
            removePrefix(&collection_name,(string *)__lhs,(string *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (collection_name._M_string_length == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xa12);
              ::std::operator<<(poVar4," ");
              pcVar5 = "empty NAME is not allowed for \'mateirial:binding:collection\'";
              goto LAB_001cf1eb;
            }
            ::std::__cxx11::string::string((string *)&ss_e,":",(allocator *)&local_228);
            rel = (uint *)0x147ae14;
            split(&names,&collection_name,(string *)&ss_e,0x147ae14);
            ::std::__cxx11::string::_M_dispose();
            if ((ulong)((long)names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
              _ss_e = (pointer)local_198;
              local_198[0]._M_local_buf[0] = '\0';
              if ((long)names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x20) {
                Token::Token((Token *)&local_228,
                             names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
                ::std::__cxx11::string::operator=((string *)&ss_e,(string *)&local_228);
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::string::_M_assign((string *)&collection_name);
              rel = (uint *)&p_Var3[0x17]._M_left;
              Token::Token((Token *)&local_228,&collection_name);
              MaterialBinding::set_materialBindingCollection
                        (local_200,(token *)&local_228,(token *)&ss_e,(Relationship *)rel);
              ::std::__cxx11::string::_M_dispose();
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs);
              ::std::__cxx11::string::_M_dispose();
              iVar6 = 3;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xa16);
              ::std::operator<<(poVar4," ");
              poVar4 = ::std::operator<<((ostream *)&ss_e,
                                         "3 or more namespaces is not allowed for \'mateirial:binding:collection\'"
                                        );
              ::std::operator<<(poVar4,"\n");
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_228,&local_1f8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_228);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              iVar6 = 1;
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&names);
LAB_001cf360:
            ::std::__cxx11::string::_M_dispose();
            if (iVar6 != 3) {
              return bVar7;
            }
          }
          goto LAB_001cf09c;
        }
        ::std::__cxx11::string::string((string *)&collection_name,":",(allocator *)&local_228);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e,
                         "material:binding",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &collection_name);
        bVar1 = startsWith((string *)__lhs,(string *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if ((!bVar1) ||
           (sVar2 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(table,(key_type *)__lhs), sVar2 != 0)) goto LAB_001cf09c;
        if (((ulong)p_Var3[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          ::std::__cxx11::string::string((string *)&local_228,":",(allocator *)&local_1f8);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e,"material:binding",&local_228);
          removePrefix(&collection_name,(string *)__lhs,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (collection_name._M_string_length == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xa34);
            ::std::operator<<(poVar4," ");
            pcVar5 = "empty PURPOSE is not allowed for \'mateirial:binding:\'";
LAB_001cf1eb:
            poVar4 = ::std::operator<<((ostream *)&ss_e,pcVar5);
            ::std::operator<<(poVar4,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_228,&local_1f8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_228);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar6 = 1;
          }
          else {
            ::std::__cxx11::string::string((string *)&ss_e,":",(allocator *)&local_228);
            rel = (uint *)0x147ae14;
            split(&names,&collection_name,(string *)&ss_e,0x147ae14);
            ::std::__cxx11::string::_M_dispose();
            if ((ulong)((long)names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
              Token::Token((Token *)&ss_e,
                           names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
              MaterialBinding::set_materialBinding
                        (local_200,(Relationship *)&p_Var3[0x17]._M_left,(token *)&ss_e);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs);
              ::std::__cxx11::string::_M_dispose();
              iVar6 = 3;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xa38);
              ::std::operator<<(poVar4," ");
              ::std::__cxx11::string::string
                        ((string *)&local_1f8,
                         "PURPOSE `{}` must not have nested namespaces for \'mateirial:binding\'",
                         &local_201);
              fmt::format<std::__cxx11::string>
                        (&local_228,(fmt *)&local_1f8,(string *)&collection_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rel);
              poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_228);
              ::std::operator<<(poVar4,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_228,&local_1f8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_228);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              iVar6 = 1;
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&names);
          }
          goto LAB_001cf360;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
        poVar4 = ::std::operator<<(poVar4,"():");
        iVar6 = 0xa2f;
LAB_001cf9d0:
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,iVar6);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_228,"`{}` must be a Relationship",(allocator *)&local_1f8);
        fmt::format<std::__cxx11::string>
                  ((string *)&collection_name,(fmt *)&local_228,(string *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rel);
        poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&collection_name);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        goto LAB_001cf544;
      }
      ::std::__cxx11::string::string
                ((string *)&ss_e,"material:binding:preview",(allocator *)&collection_name);
      sVar2 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(table,(key_type *)&ss_e);
      ::std::__cxx11::string::_M_dispose();
      if (sVar2 != 0) goto LAB_001cf09c;
      if (((ulong)p_Var3[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
        poVar4 = ::std::operator<<(poVar4,"():");
        iVar6 = 0x9f2;
        goto LAB_001cf4db;
      }
      if (3 < *(uint *)&p_Var3[0x17]._M_left) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
        poVar4 = ::std::operator<<(poVar4,"():");
        iVar6 = 0x9f2;
        goto LAB_001cf8ca;
      }
      rel = &switchD_001ceaf7::switchdataD_003319a0;
      switch(*(uint *)&p_Var3[0x17]._M_left) {
      default:
        nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                  (&local_1d8->materialBinding,(Relationship *)&p_Var3[0x17]._M_left);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs);
        goto LAB_001ceb13;
      case 2:
        if ((long)p_Var3[0x1e]._M_left - (long)p_Var3[0x1e]._M_parent != 0xd0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructMaterialBindingProperties");
          poVar4 = ::std::operator<<(poVar4,"():");
          iVar6 = 0x9f2;
          goto LAB_001cf94d;
        }
      case 1:
        this = local_1d8;
      }
LAB_001cf08a:
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                (&this->materialBinding,(Relationship *)&p_Var3[0x17]._M_left);
LAB_001cf08f:
      ::std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs
                );
LAB_001cf09c:
      p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    }
  }
  return bVar7;
}

Assistant:

bool ReconstructMaterialBindingProperties(
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  MaterialBinding *mb, /* inout */
  std::string *err)
{

  if (!mb) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBinding, mb->materialBinding)
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBindingPreview, mb->materialBindingPreview)
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBindingPreview, mb->materialBindingFull)
    // material:binding:collection
    if (prop.first == kMaterialBindingCollection) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBindingCollection(value::token(""), value::token(""), rel);

      table.insert(prop.first);
      continue;
    }
    // material:binding:collection[:PURPOSE]:NAME
    if (startsWith(prop.first, kMaterialBindingCollection + std::string(":"))) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      std::string collection_name = removePrefix(prop.first, kMaterialBindingCollection + std::string(":"));
      if (collection_name.empty()) {
        PUSH_ERROR_AND_RETURN("empty NAME is not allowed for 'mateirial:binding:collection'");
      }
      std::vector<std::string> names = split(collection_name, ":");
      if (names.size() > 2) {
        PUSH_ERROR_AND_RETURN("3 or more namespaces is not allowed for 'mateirial:binding:collection'");
      }
      value::token mat_purpose; // empty = all-purpose
      if (names.size() == 1) {
        collection_name = names[0];
      } else {
        mat_purpose = value::token(names[0]);
        collection_name = names[1];
      }

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBindingCollection(value::token(collection_name), mat_purpose, rel);

      table.insert(prop.first);
      continue;
    }
    // material:binding:PURPOSE
    if (startsWith(prop.first, kMaterialBinding + std::string(":"))) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      std::string purpose_name = removePrefix(prop.first, kMaterialBinding + std::string(":"));
      if (purpose_name.empty()) {
        PUSH_ERROR_AND_RETURN("empty PURPOSE is not allowed for 'mateirial:binding:'");
      }
      std::vector<std::string> names = split(purpose_name, ":");
      if (names.size() > 1) {
        PUSH_ERROR_AND_RETURN(fmt::format("PURPOSE `{}` must not have nested namespaces for 'mateirial:binding'", purpose_name));
      }
      value::token mat_purpose = value::token(names[0]);

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBinding(rel, mat_purpose);

      table.insert(prop.first);
      continue;
    }
  }

  return true;
}